

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  string *psVar5;
  ostream *poVar6;
  char *pcVar7;
  FILE *__stream;
  size_t sVar8;
  uint uVar9;
  char *c;
  ulong uVar10;
  cmWorkingDirectory *pcVar11;
  string_view str;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_1158;
  uint local_114c;
  string destPath;
  undefined1 local_1128 [48];
  string modulesPath;
  string resultFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string cwd;
  string outFile;
  string inFile;
  string value;
  undefined4 local_1018;
  
  resultFile._M_dataplus._M_p = (pointer)&resultFile.field_2;
  resultFile._M_string_length = 0;
  resultFile.field_2._M_local_buf[0] = '\0';
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::operator+(&destPath,&cwd,"/__cmake_systeminformation");
  cmsys::SystemTools::RemoveADirectory(&destPath);
  SVar4 = cmsys::SystemTools::MakeDirectory(&destPath,(mode_t *)0x0);
  if (SVar4.Kind_ == Success) {
    local_114c = (uint)CONCAT71(SVar4._1_7_,1);
    uVar10 = 1;
    while( true ) {
      uVar9 = (uint)uVar10;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10)
      break;
      str._M_str = pbVar1[uVar10]._M_dataplus._M_p;
      str._M_len = pbVar1[uVar10]._M_string_length;
      bVar2 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x56c9ac);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&value,(ulong)(pbVar1 + uVar10));
        if (value._M_string_length == 0) {
          uVar9 = uVar9 + 1;
          if ((ulong)uVar9 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&value);
            goto LAB_00179e76;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1128,"No generator specified for -G",
                     (allocator<char> *)&modulesPath);
          cmSystemTools::Error
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128
                    );
          std::__cxx11::string::~string((string *)local_1128);
          PrintGeneratorList(this);
          bVar2 = false;
        }
        else {
LAB_00179e76:
          CreateGlobalGenerator((cmake *)&modulesPath,(string *)this,SUB81((cmAlphaNum *)&value,0));
          if (modulesPath._M_dataplus._M_p == (pointer)0x0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1128,"Could not create named generator ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value);
            cmSystemTools::Error
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128);
            std::__cxx11::string::~string((string *)local_1128);
            PrintGeneratorList(this);
          }
          else {
            local_1158._M_head_impl = (cmGlobalGenerator *)modulesPath._M_dataplus._M_p;
            modulesPath._M_dataplus._M_p = (pointer)0x0;
            SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                     *)&local_1158);
            if (local_1158._M_head_impl != (cmGlobalGenerator *)0x0) {
              (*(local_1158._M_head_impl)->_vptr_cmGlobalGenerator[1])();
            }
            local_1158._M_head_impl = (cmGlobalGenerator *)0x0;
          }
          if (modulesPath._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)modulesPath._M_dataplus._M_p + 8))();
          }
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)&value);
        if (!bVar2) {
          iVar3 = -1;
          goto LAB_0017a366;
        }
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsFullPath(pbVar1 + uVar10);
        if (!bVar2) {
          value._M_dataplus._M_p = (pointer)cwd._M_string_length;
          value._M_string_length = (size_type)cwd._M_dataplus._M_p;
          local_1128._0_8_ = (pointer)0x1;
          local_1128._8_8_ = local_1128 + 0x10;
          local_1128[0x10] = '/';
          cmStrCat<>(&modulesPath,(cmAlphaNum *)&value,(cmAlphaNum *)local_1128);
          std::__cxx11::string::operator=((string *)&resultFile,(string *)&modulesPath);
          std::__cxx11::string::~string((string *)&modulesPath);
        }
        std::__cxx11::string::append((string *)&resultFile);
        local_114c = 0;
      }
      uVar10 = (ulong)(uVar9 + 1);
    }
    AddCMakePaths(this);
    psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    value._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
    value._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
    local_1128._0_8_ = (pointer)0x8;
    local_1128._8_8_ = "/Modules";
    cmStrCat<>(&modulesPath,(cmAlphaNum *)&value,(cmAlphaNum *)local_1128);
    value._M_dataplus._M_p = (pointer)modulesPath._M_string_length;
    value._M_string_length = (size_type)modulesPath._M_dataplus._M_p;
    local_1128._0_8_ = &DAT_00000018;
    local_1128._8_8_ = "/SystemInformation.cmake";
    cmStrCat<>(&inFile,(cmAlphaNum *)&value,(cmAlphaNum *)local_1128);
    value._M_dataplus._M_p = (pointer)destPath._M_string_length;
    value._M_string_length = (size_type)destPath._M_dataplus._M_p;
    local_1128._0_8_ = (pointer)0xf;
    local_1128._8_8_ = "/CMakeLists.txt";
    cmStrCat<>(&outFile,(cmAlphaNum *)&value,(cmAlphaNum *)local_1128);
    SVar4 = cmsys::SystemTools::CopyFileAlways(&inFile,&outFile);
    if (SVar4.Kind_ == Success) {
      if (resultFile._M_string_length == 0) {
        value._M_dataplus._M_p = (pointer)cwd._M_string_length;
        value._M_string_length = (size_type)cwd._M_dataplus._M_p;
        local_1128._0_8_ = (pointer)0x26;
        local_1128._8_8_ = "/__cmake_systeminformation/results.txt";
        cmStrCat<>((string *)&args2,(cmAlphaNum *)&value,(cmAlphaNum *)local_1128);
        std::__cxx11::string::operator=((string *)&resultFile,(string *)&args2);
        std::__cxx11::string::~string((string *)&args2);
      }
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)&value,&destPath);
      if (local_1018 == 0) {
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args2,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args2,&destPath);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128,"-DRESULT_FILE=",&resultFile);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
        std::__cxx11::string::~string((string *)local_1128);
        iVar3 = Run(this,&args2,false);
        bVar2 = iVar3 == 0;
        if (bVar2) {
          iVar3 = -1;
        }
        else {
          std::operator<<((ostream *)&std::cerr,
                          "Error: --system-information failed on internal CMake!\n");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args2);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to change to directory ");
        poVar6 = std::operator<<(poVar6,(string *)&destPath);
        poVar6 = std::operator<<(poVar6," : ");
        pcVar7 = strerror(local_1018);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar3 = 1;
        bVar2 = false;
      }
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&value);
      if (bVar2) {
        if (((local_114c & 1) != 0) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen(&resultFile,"r"), __stream != (FILE *)0x0))
        {
          while (sVar8 = fread((cmWorkingDirectory *)&value,1,0x1000,__stream), sVar8 != 0) {
            for (pcVar11 = (cmWorkingDirectory *)&value;
                pcVar11 < (cmWorkingDirectory *)((long)&value._M_dataplus._M_p + sVar8);
                pcVar11 = (cmWorkingDirectory *)((long)&(pcVar11->OldDir)._M_dataplus._M_p + 1)) {
              putc((int)*(char *)&(pcVar11->OldDir)._M_dataplus._M_p,_stdout);
            }
            fflush(_stdout);
          }
          fclose(__stream);
        }
        iVar3 = 0;
        cmsys::SystemTools::RemoveADirectory(&destPath);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
      poVar6 = std::operator<<(poVar6,(string *)&inFile);
      poVar6 = std::operator<<(poVar6,"\" to \"");
      poVar6 = std::operator<<(poVar6,(string *)&outFile);
      std::operator<<(poVar6,"\".\n");
      iVar3 = 1;
    }
    std::__cxx11::string::~string((string *)&outFile);
    std::__cxx11::string::~string((string *)&inFile);
    std::__cxx11::string::~string((string *)&modulesPath);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
    iVar3 = 1;
  }
LAB_0017a366:
  std::__cxx11::string::~string((string *)&destPath);
  std::__cxx11::string::~string((string *)&cwd);
  std::__cxx11::string::~string((string *)&resultFile);
  return iVar3;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (cmHasLiteralPrefix(arg, "-G")) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      auto gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(std::move(gen));
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cmStrCat(cwd, '/');
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules");
  std::string inFile = cmStrCat(modulesPath, "/SystemInformation.cmake");
  std::string outFile = cmStrCat(destPath, "/CMakeLists.txt");

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cmStrCat(cwd, "/__cmake_systeminformation/results.txt");
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}